

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O0

int zddGroupSiftingUp(DdManager *table,int y,int xLow,Move **moves)

{
  DdHalfWord x_00;
  Move *pMVar1;
  uint uVar2;
  DdNode *pDVar3;
  uint local_40;
  int limitSize;
  int gxtop;
  int size;
  int x;
  Move *move;
  Move **moves_local;
  int xLow_local;
  int y_local;
  DdManager *table_local;
  
  local_40 = table->keysZ;
  gxtop = cuddZddNextLow(table,y);
  moves_local._4_4_ = y;
  do {
    if (gxtop < xLow) {
      return 1;
    }
    x_00 = table->subtableZ[gxtop].next;
    if ((table->subtableZ[gxtop].next == gxtop) &&
       (table->subtableZ[(int)moves_local._4_4_].next == moves_local._4_4_)) {
      uVar2 = cuddZddSwapInPlace(table,gxtop,moves_local._4_4_);
      if ((uVar2 == 0) || (pDVar3 = cuddDynamicAllocNode(table), pDVar3 == (DdNode *)0x0)) {
LAB_00c241f9:
        while (*moves != (Move *)0x0) {
          pMVar1 = (*moves)->next;
          (*moves)->y = 0;
          *(DdNode **)&(*moves)->flags = table->nextFree;
          table->nextFree = (DdNode *)*moves;
          *moves = pMVar1;
        }
        return 0;
      }
      pDVar3->index = gxtop;
      pDVar3->ref = moves_local._4_4_;
      *(undefined4 *)&pDVar3->next = 0;
      *(uint *)((long)&pDVar3->next + 4) = uVar2;
      (pDVar3->type).kids.T = (DdNode *)*moves;
      *moves = (Move *)pDVar3;
      if ((double)(int)local_40 * table->maxGrowth < (double)(int)uVar2) {
        return 1;
      }
      if ((int)uVar2 < (int)local_40) {
        local_40 = uVar2;
      }
    }
    else {
      uVar2 = zddGroupMove(table,gxtop,moves_local._4_4_,moves);
      if (uVar2 == 0) goto LAB_00c241f9;
      if ((double)(int)local_40 * table->maxGrowth < (double)(int)uVar2) {
        return 1;
      }
      if ((int)uVar2 < (int)local_40) {
        local_40 = uVar2;
      }
    }
    gxtop = cuddZddNextLow(table,x_00);
    moves_local._4_4_ = x_00;
  } while( true );
}

Assistant:

static int
zddGroupSiftingUp(
  DdManager * table,
  int  y,
  int  xLow,
  Move ** moves)
{
    Move *move;
    int  x;
    int  size;
    int  gxtop;
    int  limitSize;

    limitSize = table->keysZ;

    x = cuddZddNextLow(table,y);
    while (x >= xLow) {
        gxtop = table->subtableZ[x].next;
        if (table->subtableZ[x].next == (unsigned) x &&
            table->subtableZ[y].next == (unsigned) y) {
            /* x and y are self groups */
            size = cuddZddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtableZ[x].next == (unsigned) x);
            assert(table->subtableZ[y].next == (unsigned) y);
#endif
            if (size == 0) goto zddGroupSiftingUpOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto zddGroupSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_DEFAULT;
            move->size = size;
            move->next = *moves;
            *moves = move;

#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"zddGroupSiftingUp (2 single groups):\n");
#endif
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        } else { /* group move */
            size = zddGroupMove(table,x,y,moves);
            if (size == 0) goto zddGroupSiftingUpOutOfMem;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        }
        y = gxtop;
        x = cuddZddNextLow(table,y);
    }

    return(1);

zddGroupSiftingUpOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}